

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

int fits_hcompress(int *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  void *pvVar5;
  sbyte sVar6;
  byte bVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint n;
  int *piVar24;
  long *plVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  int vmax [3];
  undefined2 local_f3;
  byte local_f1;
  int *local_f0;
  undefined4 local_e4;
  uint local_e0 [4];
  char *local_d0;
  uint local_c8;
  int local_c4;
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  void *local_b0;
  ulong local_a8;
  int local_a0;
  int local_9c;
  ulong local_98;
  uint local_8c;
  long *local_88;
  long local_80;
  long local_78;
  int local_6c;
  int local_68;
  uint local_64;
  int *local_60;
  int *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_b8 = CONCAT44(in_register_00000014,nx);
  local_50 = CONCAT44(in_register_0000000c,scale);
  if (0 < *status) {
    return *status;
  }
  uVar11 = (ulong)(uint)ny;
  iVar2 = ny;
  if (ny < nx) {
    iVar2 = nx;
  }
  local_f0 = a;
  local_d0 = output;
  dVar32 = log((double)iVar2);
  iVar27 = (int)(dVar32 / 0.6931471805599453 + 0.5);
  local_b0 = (void *)CONCAT71(local_b0._1_7_,1 << ((byte)iVar27 & 0x1f) < iVar2);
  piVar3 = (int *)malloc((long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) << 2);
  local_60 = piVar3;
  if (piVar3 == (int *)0x0) {
    ffpmsg("htrans: insufficient memory");
    iVar2 = 0x19d;
    goto LAB_0017552f;
  }
  iVar27 = (uint)(byte)local_b0 + iVar27;
  local_a8 = uVar11;
  local_88 = nbytes;
  if (0 < iVar27) {
    local_40 = (ulong)(uint)(ny * 2);
    local_58 = local_f0 + 1;
    lVar13 = (long)ny << 2;
    uVar19 = 0xfffffffe;
    uVar8 = 0xfffffffc;
    uVar10 = 2;
    uVar22 = 1;
    iVar2 = 1;
    uVar18 = 0;
    iVar15 = 0;
    uVar30 = local_b8 & 0xffffffff;
    local_78 = lVar13;
    local_6c = iVar27;
    local_48 = uVar11;
    do {
      local_b0 = (void *)(ulong)uVar10;
      local_c8 = (uint)uVar30;
      local_8c = (int)(uVar30 >> 0x1f) + local_c8 & 0xfffffffe;
      n = (uint)uVar11;
      local_c4 = n - ((int)(uVar11 >> 0x1f) + n & 0xfffffffe);
      iVar27 = 0;
      bVar1 = (byte)uVar18;
      local_98._0_4_ = (uint)uVar8;
      ny = (int)local_a8;
      if (0 < (int)local_8c) {
        local_bc = n - local_c4;
        local_64 = uVar18 ^ 1;
        uVar11 = local_48;
        lVar14 = 0;
        iVar27 = 0;
        do {
          local_9c = iVar27;
          local_80 = lVar14;
          if ((int)local_bc < 1) {
            iVar26 = local_9c * ny;
            iVar27 = ny + iVar26;
          }
          else {
            iVar27 = (int)uVar11;
            iVar16 = (int)local_80;
            lVar13 = 0;
            do {
              iVar26 = local_58[(long)iVar27 + lVar13 + -1] + local_58[iVar27 + lVar13];
              iVar12 = local_58[(long)iVar16 + lVar13 + -1];
              iVar21 = local_58[iVar16 + lVar13];
              iVar23 = iVar21 + iVar12 + iVar26 >> bVar1;
              iVar29 = iVar26 - (iVar21 + iVar12) >> bVar1;
              iVar20 = local_58[iVar27 + lVar13] - local_58[(long)iVar27 + lVar13 + -1];
              iVar28 = (iVar20 + iVar21) - iVar12 >> bVar1;
              iVar26 = iVar2;
              if (iVar29 < 0) {
                iVar26 = 0;
              }
              local_58[iVar27 + lVar13] = (iVar20 - iVar21) + iVar12 >> bVar1;
              local_58[(long)iVar27 + lVar13 + -1] = iVar26 + iVar29 & uVar19;
              iVar26 = iVar2;
              if (iVar28 < 0) {
                iVar26 = 0;
              }
              local_58[iVar16 + lVar13] = iVar26 + iVar28 & uVar19;
              uVar18 = uVar10;
              if (iVar23 < 0) {
                uVar18 = uVar22;
              }
              local_58[(long)iVar16 + lVar13 + -1] = uVar18 + iVar23 & (uint)local_98;
              lVar13 = lVar13 + 2;
              iVar26 = (int)lVar13;
            } while (iVar26 < (int)local_bc);
            iVar27 = iVar27 + iVar26;
            iVar26 = iVar26 + iVar16;
            lVar13 = local_78;
            piVar3 = local_60;
            local_38 = uVar11;
          }
          if (local_c4 != 0) {
            iVar16 = local_f0[iVar26] + local_f0[iVar27];
            sVar6 = (sbyte)local_64;
            iVar21 = local_f0[iVar27] - local_f0[iVar26];
            iVar12 = iVar2;
            if (iVar21 << sVar6 < 0) {
              iVar12 = 0;
            }
            uVar18 = uVar10;
            if (iVar16 << sVar6 < 0) {
              uVar18 = uVar22;
            }
            local_f0[iVar27] = iVar12 + (iVar21 << sVar6) & uVar19;
            local_f0[iVar26] = uVar18 + (iVar16 << sVar6) & (uint)local_98;
            lVar13 = local_78;
          }
          iVar27 = local_9c + 2;
          uVar11 = uVar11 + local_40;
          lVar14 = local_80 + local_40;
          local_c0 = uVar22;
        } while (iVar27 < (int)local_8c);
      }
      if (local_c8 != local_8c) {
        iVar27 = iVar27 * ny;
        iVar26 = iVar27;
        if (local_c4 < (int)n) {
          bVar7 = bVar1 ^ 1;
          lVar13 = 0;
          do {
            iVar26 = local_58[(long)iVar27 + lVar13 + -1] + local_58[iVar27 + lVar13];
            iVar12 = local_58[iVar27 + lVar13] - local_58[(long)iVar27 + lVar13 + -1];
            iVar16 = iVar2;
            if (iVar12 << bVar7 < 0) {
              iVar16 = 0;
            }
            local_58[iVar27 + lVar13] = iVar16 + (iVar12 << bVar7) & uVar19;
            uVar18 = uVar10;
            if (iVar26 << bVar7 < 0) {
              uVar18 = uVar22;
            }
            local_58[(long)iVar27 + lVar13 + -1] = uVar18 + (iVar26 << bVar7) & (uint)local_98;
            lVar13 = lVar13 + 2;
          } while ((int)lVar13 < (int)(n - local_c4));
          iVar26 = iVar27 + (int)lVar13;
          lVar13 = local_78;
          local_9c = iVar27;
        }
        if (local_c4 != 0) {
          bVar1 = 2 - bVar1 & 0x1f;
          if (-1 < local_f0[iVar26] << bVar1) {
            uVar22 = uVar10;
          }
          local_f0[iVar26] = uVar22 + (local_f0[iVar26] << bVar1) & (uint)local_98;
        }
      }
      piVar24 = local_f0;
      local_e4 = n;
      local_a0 = iVar2;
      local_98 = uVar8;
      local_68 = iVar15;
      if (0 < (int)local_c8) {
        do {
          shuffle(piVar24,n,1,piVar3);
          uVar30 = uVar30 - 1;
          piVar24 = (int *)((long)piVar24 + lVar13);
        } while (uVar30 != 0);
      }
      uVar19 = local_c8;
      if (0 < (int)n) {
        uVar11 = (ulong)local_e4;
        piVar24 = local_f0;
        do {
          shuffle(piVar24,uVar19,ny,piVar3);
          piVar24 = piVar24 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      uVar30 = (ulong)(uint)((int)(uVar19 + 1) >> 1);
      uVar11 = (ulong)(uint)((int)(local_e4 + 1) >> 1);
      uVar19 = (uint)local_98;
      uVar8 = (ulong)(uVar19 * 2);
      iVar2 = (int)local_b0;
      uVar10 = iVar2 * 2;
      uVar22 = iVar2 * 2 - 1;
      iVar15 = local_68 + 1;
      uVar18 = 1;
    } while (iVar15 != local_6c);
  }
  piVar24 = local_f0;
  free(piVar3);
  iVar2 = (int)local_50;
  if ((1 < iVar2) && (piVar24 <= piVar24 + (long)((int)local_b8 * ny) + -1)) {
    uVar19 = iVar2 + 1U >> 1;
    piVar3 = piVar24;
    do {
      iVar27 = 1 - uVar19;
      if (0 < *piVar3) {
        iVar27 = uVar19 - 1;
      }
      *piVar3 = (iVar27 + *piVar3) / iVar2;
      piVar3 = piVar3 + 1;
    } while (piVar3 <= piVar24 + (long)((int)local_b8 * ny) + -1);
  }
  uVar19 = (int)local_b8 * ny;
  lVar13 = *local_88;
  lVar14 = 0;
  noutmax = lVar13;
  *local_88 = 0;
  noutchar = 0;
  if (1 < lVar13) {
    local_d0[0] = -0x23;
    local_d0[1] = -0x67;
    noutchar = 2;
    lVar14 = 2;
  }
  lVar4 = 4;
  uVar11 = local_b8;
  do {
    *(char *)((long)&local_e4 + lVar4 + 3) = (char)uVar11;
    uVar11 = (ulong)(uint)((int)uVar11 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar14 < lVar13) {
      local_d0[lVar14] = *(char *)((long)local_e0 + lVar4);
      lVar14 = lVar14 + 1;
      noutchar = lVar14;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 4;
  uVar11 = local_a8;
  do {
    *(char *)((long)&local_e4 + lVar4 + 3) = (char)uVar11;
    uVar11 = (ulong)(uint)((int)uVar11 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar14 < lVar13) {
      local_d0[lVar14] = *(char *)((long)local_e0 + lVar4);
      lVar14 = lVar14 + 1;
      noutchar = lVar14;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 4;
  uVar11 = local_50;
  do {
    *(char *)((long)&local_e4 + lVar4 + 3) = (char)uVar11;
    uVar11 = (ulong)(uint)((int)uVar11 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar14 < lVar13) {
      local_d0[lVar14] = *(char *)((long)local_e0 + lVar4);
      lVar14 = lVar14 + 1;
      noutchar = lVar14;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  iVar2 = *piVar24;
  lVar4 = 8;
  do {
    *(char *)((long)&local_e4 + lVar4 + 3) = (char)iVar2;
    iVar2 = iVar2 >> 8;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar14 < lVar13) {
      local_d0[lVar14] = *(char *)((long)local_e0 + lVar4);
      lVar14 = lVar14 + 1;
      noutchar = lVar14;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  *piVar24 = 0;
  iVar2 = uVar19 + 0xe;
  if (-1 < (int)(uVar19 + 7)) {
    iVar2 = uVar19 + 7;
  }
  pvVar5 = calloc(1,(long)(iVar2 >> 3));
  uVar11 = local_a8;
  piVar3 = local_f0;
  if (pvVar5 == (void *)0x0) {
    pcVar17 = "encode: insufficient memory";
  }
  else {
    iVar2 = (int)local_b8;
    iVar27 = (int)local_a8;
    if ((int)uVar19 < 1) {
      local_e0[2] = 0;
      local_e0[0] = 0;
      local_e0[1] = 0;
      iVar15 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
      iVar26 = (iVar27 - (iVar27 + 1 >> 0x1f)) + 1 >> 1;
      uVar10 = 0;
    }
    else {
      uVar8 = 0;
      iVar15 = 8;
      uVar30 = 0;
      do {
        iVar26 = local_f0[uVar8];
        uVar30 = uVar30 & 0xffffffff;
        if (iVar26 < 1) {
          if (iVar26 < 0) {
            *(char *)((long)pvVar5 + uVar30) = *(char *)((long)pvVar5 + uVar30) * '\x02' + '\x01';
            iVar15 = iVar15 + -1;
            local_f0[uVar8] = -iVar26;
          }
        }
        else {
          *(char *)((long)pvVar5 + uVar30) = *(char *)((long)pvVar5 + uVar30) << 1;
          iVar15 = iVar15 + -1;
        }
        bVar31 = iVar15 == 0;
        if (bVar31) {
          iVar15 = 8;
        }
        uVar30 = bVar31 + uVar30;
        uVar8 = uVar8 + 1;
      } while (uVar19 != uVar8);
      if (iVar15 != 8) {
        *(char *)((long)pvVar5 + uVar30) = *(char *)((long)pvVar5 + uVar30) << ((byte)iVar15 & 0x1f)
        ;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
      uVar10 = (uint)uVar30;
      local_e0[2] = 0;
      local_e0[0] = 0;
      local_e0[1] = 0;
      iVar15 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
      iVar26 = (iVar27 - (iVar27 + 1 >> 0x1f)) + 1 >> 1;
      uVar8 = 0;
      iVar16 = 0;
      iVar2 = 0;
      do {
        uVar18 = (uint)(iVar26 <= iVar2) + (uint)(iVar15 <= iVar16);
        uVar22 = local_f0[uVar8];
        if (local_f0[uVar8] < (int)local_e0[uVar18]) {
          uVar22 = local_e0[uVar18];
        }
        local_e0[uVar18] = uVar22;
        iVar12 = iVar2 + 1;
        iVar2 = iVar12;
        if (iVar27 <= iVar12) {
          iVar2 = 0;
        }
        iVar16 = iVar16 + (uint)(iVar27 <= iVar12);
        uVar8 = uVar8 + 1;
      } while (uVar19 != uVar8);
    }
    lVar4 = 0;
    do {
      uVar19 = local_e0[lVar4];
      cVar9 = '\0';
      uVar22 = uVar19;
      if (0 < (int)uVar19) {
        do {
          uVar19 = uVar22 >> 1;
          cVar9 = cVar9 + '\x01';
          bVar31 = 1 < uVar22;
          uVar22 = uVar19;
        } while (bVar31);
      }
      *(char *)((long)&local_f3 + lVar4) = cVar9;
      local_e0[lVar4] = uVar19;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    plVar25 = local_88;
    local_b0 = pvVar5;
    if (lVar13 < lVar14 + 3) {
LAB_00175511:
      *plVar25 = lVar14;
      pcVar17 = "encode: output buffer too small";
    }
    else {
      local_d0[lVar14 + 2] = local_f1;
      *(undefined2 *)(local_d0 + lVar14) = local_f3;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = lVar14 + 3;
      iVar2 = qtree_encode(local_d0,local_f0,iVar27,iVar15,iVar26,(uint)(byte)local_f3);
      if (iVar2 == 0) {
        uVar19 = (int)(((uint)(uVar11 >> 0x1f) & 1) + iVar27) >> 1;
        local_bc = (uint)local_f3._1_1_;
        iVar2 = qtree_encode(local_d0,piVar3 + iVar26,iVar27,iVar15,uVar19,local_bc);
        piVar3 = local_f0;
        if (iVar2 == 0) {
          iVar2 = (int)(((uint)(local_b8 >> 0x1f) & 1) + (int)local_b8) >> 1;
          local_80 = CONCAT44(local_80._4_4_,iVar2);
          local_c0 = uVar19;
          iVar2 = qtree_encode(local_d0,local_f0 + iVar15 * iVar27,iVar27,iVar2,iVar26,local_bc);
          if (iVar2 == 0) {
            iVar2 = qtree_encode(local_d0,piVar3 + (iVar15 * iVar27 + iVar26),iVar27,(int)local_80,
                                 local_c0,(uint)local_f1);
          }
        }
      }
      pcVar17 = local_d0;
      output_nybble(local_d0,0);
      plVar25 = local_88;
      pvVar5 = local_b0;
      lVar14 = noutchar;
      lVar13 = noutmax;
      lVar4 = (long)bits_to_go2;
      if (lVar4 < 8) {
        pcVar17[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
        if (lVar14 < lVar13) {
          lVar14 = lVar14 + 1;
          noutchar = lVar14;
        }
        bitcount = bitcount + lVar4;
      }
      if (0 < (int)uVar10) {
        lVar4 = lVar14 + (ulong)uVar10;
        if (lVar13 < lVar4) {
          free(local_b0);
          goto LAB_00175511;
        }
        memcpy(pcVar17 + lVar14,local_b0,(ulong)uVar10);
        lVar14 = lVar4;
        noutchar = lVar4;
      }
      free(pvVar5);
      *plVar25 = lVar14;
      if (lVar14 < lVar13) goto LAB_0017552f;
      pcVar17 = "encode: output buffer too small";
    }
  }
  ffpmsg(pcVar17);
  iVar2 = 0x19d;
LAB_0017552f:
  *status = iVar2;
  return iVar2;
}

Assistant:

int fits_hcompress(int *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - input value = size of the output buffer;
            returned value = size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;
  
  *status = stat;
  return(*status);
}